

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Value * json_object_getn_value(JSON_Object *object,char *name,size_t name_len)

{
  undefined8 in_RAX;
  size_t sVar1;
  JSON_Value *pJVar2;
  unsigned_long hash;
  undefined8 uStack_18;
  
  if (name == (char *)0x0 || object == (JSON_Object *)0x0) {
    return (JSON_Value *)0x0;
  }
  if (name_len == 0) {
    hash = 0x1505;
  }
  else {
    hash = 0x1505;
    sVar1 = 0;
    do {
      if ((ulong)(byte)name[sVar1] == 0) break;
      hash = hash * 0x21 + (ulong)(byte)name[sVar1];
      sVar1 = sVar1 + 1;
    } while (name_len != sVar1);
  }
  uStack_18 = CONCAT71((int7)((ulong)in_RAX >> 8),object == (JSON_Object *)0x0) & 0xffffffff;
  sVar1 = json_object_get_cell_ix(object,name,name_len,hash,(parson_bool_t *)((long)&uStack_18 + 4))
  ;
  if (uStack_18._4_4_ == 0) {
    pJVar2 = (JSON_Value *)0x0;
  }
  else {
    pJVar2 = object->values[object->cells[sVar1]];
  }
  return pJVar2;
}

Assistant:

static JSON_Value * json_object_getn_value(const JSON_Object *object, const char *name, size_t name_len) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    if (!object || !name) {
        return NULL;
    }
    hash = hash_string(name, name_len);
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, name_len, hash, &found);
    if (!found) {
        return NULL;
    }
    item_ix = object->cells[cell_ix];
    return object->values[item_ix];
}